

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.hpp
# Opt level: O2

uint64_t pstore::varint::decode<unsigned_char*>(uchar *in,uint size)

{
  byte bVar1;
  uint uVar2;
  uint64_t uVar3;
  sbyte sVar4;
  byte bVar5;
  ulong uVar6;
  
  if ((size == 0) || (uVar2 = decode_size<unsigned_char*>(in), uVar2 != size)) {
    assert_failed("size > 0 && size == decode_size (in)",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/varint.hpp"
                  ,0x86);
  }
  uVar6 = 0;
  switch(size) {
  case 2:
    bVar5 = 0;
    goto LAB_0010dadc;
  case 3:
    bVar5 = 0;
    goto LAB_0010dacc;
  case 4:
    bVar5 = 0;
    goto LAB_0010dabc;
  case 5:
    sVar4 = 0;
    goto LAB_0010daac;
  case 6:
    sVar4 = 0;
    goto LAB_0010da9c;
  case 7:
    sVar4 = 0;
    break;
  case 8:
    uVar6 = (ulong)*in;
    in = in + 1;
    sVar4 = 8;
    break;
  case 9:
    uVar3 = details::decode9<unsigned_char*>(in);
    return uVar3;
  default:
    bVar5 = 0;
    goto LAB_0010daec;
  }
  bVar5 = *in;
  in = in + 1;
  uVar6 = uVar6 | (ulong)bVar5 << sVar4;
  sVar4 = sVar4 + 8;
LAB_0010da9c:
  bVar5 = *in;
  in = in + 1;
  uVar6 = uVar6 | (ulong)bVar5 << sVar4;
  sVar4 = sVar4 + 8;
LAB_0010daac:
  bVar5 = *in;
  in = in + 1;
  uVar6 = uVar6 | (ulong)bVar5 << sVar4;
  bVar5 = sVar4 + 8;
LAB_0010dabc:
  bVar1 = *in;
  in = in + 1;
  uVar6 = uVar6 | (ulong)bVar1 << (bVar5 & 0x3f);
  bVar5 = bVar5 + 8;
LAB_0010dacc:
  bVar1 = *in;
  in = in + 1;
  uVar6 = uVar6 | (ulong)bVar1 << (bVar5 & 0x3f);
  bVar5 = bVar5 + 8;
LAB_0010dadc:
  bVar1 = *in;
  in = in + 1;
  uVar6 = uVar6 | (ulong)bVar1 << (bVar5 & 0x3f);
  bVar5 = bVar5 + 8;
LAB_0010daec:
  return ((ulong)*in << (bVar5 & 0x3f) | uVar6) >> ((byte)size & 0x3f);
}

Assistant:

std::uint64_t decode (InputIterator in, unsigned size) {
            PSTORE_ASSERT (size > 0 && size == decode_size (in));
            if (size == 9) {
                return details::decode9 (in);
            }

            auto result = std::uint64_t{0};
            auto shift = 0U;
            // clang-format off
            switch (size) {
            // NOLINTNEXTLINE(bugprone-branch-clone)
            case 8: result |= std::uint64_t{*(in++)} << shift; shift += 8; PSTORE_FALLTHROUGH;
            case 7: result |= std::uint64_t{*(in++)} << shift; shift += 8; PSTORE_FALLTHROUGH;
            case 6: result |= std::uint64_t{*(in++)} << shift; shift += 8; PSTORE_FALLTHROUGH;
            case 5: result |= std::uint64_t{*(in++)} << shift; shift += 8; PSTORE_FALLTHROUGH;
            case 4: result |= std::uint64_t{*(in++)} << shift; shift += 8; PSTORE_FALLTHROUGH;
            case 3: result |= std::uint64_t{*(in++)} << shift; shift += 8; PSTORE_FALLTHROUGH;
            case 2: result |= std::uint64_t{*(in++)} << shift; shift += 8; PSTORE_FALLTHROUGH;
            default:
                result |= std::uint64_t{*(in++)} << shift;
            }
            // clang-format on
            return result >> size; // throw away the unwanted size bytes frm the first byte.
        }